

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_988a7::BuildContext::emitError(BuildContext *this,string *message)

{
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"error",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)message);
  emitDiagnostic(this,&local_40,&local_60);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  LOCK();
  (this->numErrors).super___atomic_base<unsigned_int>._M_i =
       (this->numErrors).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void emitError(std::string&& message) {
    emitDiagnostic("error", std::move(message));
    ++numErrors;
  }